

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O0

uint stb_vorbis_get_file_offset(stb_vorbis *f)

{
  int iVar1;
  long in_RDI;
  undefined4 local_4;
  
  if (*(long *)(in_RDI + 0x40) == 0) {
    iVar1 = (**(code **)(*(long *)(in_RDI + 0x30) + 0x10))(**(undefined8 **)(in_RDI + 0x30),0,1);
    local_4 = iVar1 - *(int *)(in_RDI + 0x38);
  }
  else {
    local_4 = (int)*(undefined8 *)(in_RDI + 0x40) - (int)*(undefined8 *)(in_RDI + 0x48);
  }
  return local_4;
}

Assistant:

unsigned int stb_vorbis_get_file_offset(stb_vorbis *f)
{
   #ifndef STB_VORBIS_NO_PUSHDATA_API
   if (f->push_mode) return 0;
   #endif
   if (USE_MEMORY(f)) return (unsigned int) (f->stream - f->stream_start);
   #ifndef STB_VORBIS_NO_STDIO
   return (unsigned int) (ftell(f->f) - f->f_start);
   #endif
}